

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strscan.c
# Opt level: O0

StrScanFmt lj_strscan_scan(uint8_t *p,MSize len,TValue *o,uint32_t opt)

{
  StrScanFmt SVar1;
  byte *pbVar2;
  byte *pbVar3;
  double dVar4;
  byte bVar5;
  uint in_ECX;
  TValue *in_RDX;
  uint in_ESI;
  byte *in_RDI;
  bool bVar6;
  double dVar7;
  int32_t i;
  double n;
  int negx;
  uint32_t xx;
  int32_t ex;
  uint32_t x;
  uint32_t hasdig;
  uint32_t dig;
  uint8_t *dp;
  uint8_t *sp;
  int base;
  int cmask;
  StrScanFmt fmt;
  TValue tmp;
  uint8_t *pe;
  int32_t neg;
  int32_t in_stack_00000200;
  int32_t in_stack_00000204;
  uint32_t in_stack_00000208;
  StrScanFmt in_stack_0000020c;
  TValue *in_stack_00000210;
  uint8_t *in_stack_00000218;
  uint32_t in_stack_00000230;
  uint32_t local_94;
  undefined8 in_stack_ffffffffffffff70;
  uint32_t in_stack_ffffffffffffff78;
  StrScanFmt in_stack_ffffffffffffff7c;
  undefined2 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff82;
  bool bVar8;
  int32_t in_stack_ffffffffffffff84;
  uint8_t *in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff90;
  StrScanFmt in_stack_ffffffffffffff94;
  int iVar9;
  uint32_t dig_00;
  uint local_5c;
  byte *local_58;
  uint local_44;
  StrScanFmt local_3c;
  TValue local_38;
  uint local_28;
  byte *local_10;
  
  local_28 = 0;
  local_10 = in_RDI;
  if ((""[(ulong)*in_RDI + 1] & 8) == 0) {
    while ((""[(ulong)*local_10 + 1] & 2) != 0) {
      local_10 = local_10 + 1;
    }
    if ((*local_10 == 0x2b) || (*local_10 == 0x2d)) {
      local_28 = (uint)(*local_10 == 0x2d);
      local_10 = local_10 + 1;
    }
    if (0x40 < *local_10) {
      local_38.u64 = 0xfff8000000000000;
      if ((((*local_10 | 0x20) == 0x69) && ((local_10[1] | 0x20) == 0x6e)) &&
         ((local_10[2] | 0x20) == 0x66)) {
        if (local_28 == 0) {
          local_38.u64 = 0x7ff0000000000000;
        }
        else {
          local_38.u64 = 0xfff0000000000000;
        }
        pbVar2 = local_10 + 3;
        if ((((*pbVar2 | 0x20) == 0x69) && ((local_10[4] | 0x20) == 0x6e)) &&
           (((local_10[5] | 0x20) == 0x69 &&
            (((local_10[6] | 0x20) == 0x74 && ((local_10[7] | 0x20) == 0x79)))))) {
          pbVar2 = local_10 + 8;
        }
      }
      else {
        pbVar2 = local_10;
        if ((((*local_10 | 0x20) == 0x6e) && ((local_10[1] | 0x20) == 0x61)) &&
           ((local_10[2] | 0x20) == 0x6e)) {
          pbVar2 = local_10 + 3;
        }
      }
      while (local_10 = pbVar2, (""[(ulong)*local_10 + 1] & 2) != 0) {
        pbVar2 = local_10 + 1;
      }
      if ((*local_10 == 0) && (in_RDI + in_ESI <= local_10)) {
        *in_RDX = local_38;
        return STRSCAN_NUM;
      }
      return STRSCAN_ERROR;
    }
  }
  local_3c = STRSCAN_INT;
  bVar5 = 8;
  bVar8 = false;
  if ((in_ECX & 0x10) != 0) {
    bVar8 = *local_10 == 0x30;
  }
  local_44 = 10;
  if (bVar8 != false) {
    local_44 = 0;
  }
  local_58 = (byte *)0x0;
  local_5c = 0;
  dig_00 = 0;
  local_94 = 0;
  iVar9 = 0;
  pbVar2 = local_10;
  if (0x30 < *local_10) {
LAB_0012ab75:
    do {
      if ((""[(ulong)*local_10 + 1] & bVar5) == 0) {
        if (*local_10 != 0x2e) {
          if (dig_00 == 0 && local_5c == 0) {
            return STRSCAN_ERROR;
          }
          if (local_58 != (byte *)0x0) {
            if (local_44 == 2) {
              return STRSCAN_ERROR;
            }
            local_3c = STRSCAN_NUM;
            if (local_5c != 0) {
              iVar9 = (int)local_58 - ((int)local_10 + -1);
              local_58 = local_10 + -1;
              while( true ) {
                bVar6 = false;
                if (iVar9 < 0) {
                  bVar6 = *local_58 == 0x30;
                  local_58 = local_58 + -1;
                }
                if (!bVar6) break;
                iVar9 = iVar9 + 1;
                local_5c = local_5c - 1;
              }
              if (iVar9 < -0xfffff) {
                return STRSCAN_ERROR;
              }
              if (local_44 == 0x10) {
                iVar9 = iVar9 << 2;
              }
              in_stack_ffffffffffffff82 = 0;
            }
          }
          if (9 < local_44) {
            bVar5 = 0x65;
            if (local_44 == 0x10) {
              bVar5 = 0x70;
            }
            if ((*local_10 | 0x20) == bVar5) {
              in_stack_ffffffffffffff90 = 0;
              local_3c = STRSCAN_NUM;
              pbVar3 = local_10 + 1;
              if ((*pbVar3 == 0x2b) || (*pbVar3 == 0x2d)) {
                in_stack_ffffffffffffff90 = (uint)(*pbVar3 == 0x2d);
                pbVar3 = local_10 + 2;
              }
              local_10 = pbVar3;
              if ((""[(ulong)*local_10 + 1] & 8) == 0) {
                return STRSCAN_ERROR;
              }
              in_stack_ffffffffffffff94 = *local_10 & 0xf;
              while (local_10 = local_10 + 1, (""[(ulong)*local_10 + 1] & 8) != 0) {
                in_stack_ffffffffffffff94 = in_stack_ffffffffffffff94 * 10 + (*local_10 & 0xf);
                if (0xfffff < in_stack_ffffffffffffff94) {
                  return STRSCAN_ERROR;
                }
              }
              in_stack_ffffffffffffff7c = in_stack_ffffffffffffff94;
              if (in_stack_ffffffffffffff90 != 0) {
                in_stack_ffffffffffffff7c =
                     (in_stack_ffffffffffffff94 ^ ~STRSCAN_ERROR) + STRSCAN_NUM;
              }
              iVar9 = in_stack_ffffffffffffff7c + iVar9;
            }
          }
          if (*local_10 != 0) {
            if ((*local_10 | 0x20) == 0x69) {
              if ((in_ECX & 4) == 0) {
                return STRSCAN_ERROR;
              }
              local_10 = local_10 + 1;
              local_3c = STRSCAN_IMAG;
            }
            else if (local_3c == STRSCAN_INT) {
              if ((*local_10 | 0x20) == 0x75) {
                local_10 = local_10 + 1;
                local_3c = STRSCAN_U32;
              }
              if ((*local_10 | 0x20) == 0x6c) {
                if ((local_10[1] | 0x20) == 0x6c) {
                  local_10 = local_10 + 2;
                }
                else {
                  local_10 = local_10 + 1;
                  if ((in_ECX & 0x10) == 0) {
                    return STRSCAN_ERROR;
                  }
                }
                local_3c = local_3c + STRSCAN_IMAG;
              }
              if (((*local_10 | 0x20) == 0x75) &&
                 ((local_3c == STRSCAN_INT || (local_3c == STRSCAN_I64)))) {
                local_10 = local_10 + 1;
                local_3c = local_3c + STRSCAN_NUM;
              }
              if (((local_3c == STRSCAN_U32) && ((in_ECX & 0x10) == 0)) ||
                 ((STRSCAN_U32 < local_3c && ((in_ECX & 8) == 0)))) {
                return STRSCAN_ERROR;
              }
            }
            while ((""[(ulong)*local_10 + 1] & 2) != 0) {
              local_10 = local_10 + 1;
            }
            if (*local_10 != 0) {
              return STRSCAN_ERROR;
            }
          }
          if (local_10 < in_RDI + in_ESI) {
            return STRSCAN_ERROR;
          }
          if (((local_3c == STRSCAN_INT) && (local_44 == 10)) &&
             ((local_5c < 10 ||
              (((local_5c == 10 && (*pbVar2 < 0x33)) && (local_94 < local_28 + 0x80000000)))))) {
            if ((in_ECX & 2) != 0) {
              if (local_28 == 0) {
                dVar4 = (double)local_94;
              }
              else {
                dVar4 = -(double)local_94;
              }
              in_RDX->n = dVar4;
              return STRSCAN_NUM;
            }
            if ((local_94 == 0) && (local_28 != 0)) {
              in_RDX->u64 = 0x8000000000000000;
              return STRSCAN_NUM;
            }
            if (local_28 != 0) {
              local_94 = (local_94 ^ 0xffffffff) + 1;
            }
            (in_RDX->u32).lo = local_94;
            return STRSCAN_INT;
          }
          if (((local_44 == 0) && (local_3c != STRSCAN_NUM)) && (local_3c != STRSCAN_IMAG)) {
            SVar1 = strscan_oct(pbVar2,in_RDX,local_3c,local_28,local_5c);
            return SVar1;
          }
          if (local_44 == 0x10) {
            local_3c = strscan_hex((uint8_t *)CONCAT44(local_94,iVar9),
                                   (TValue *)
                                   CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                                   (StrScanFmt)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                                   (uint32_t)in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                                   CONCAT13(bVar8,CONCAT12(in_stack_ffffffffffffff82,
                                                           in_stack_ffffffffffffff80)),
                                   (uint32_t)pbVar2);
          }
          else if (local_44 == 2) {
            local_3c = strscan_bin(in_stack_ffffffffffffff88,
                                   (TValue *)
                                   CONCAT44(in_stack_ffffffffffffff84,
                                            CONCAT13(bVar8,CONCAT12(in_stack_ffffffffffffff82,
                                                                    in_stack_ffffffffffffff80))),
                                   in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
                                   (int32_t)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                                   (int32_t)in_stack_ffffffffffffff70,dig_00);
          }
          else {
            local_3c = strscan_dec(in_stack_00000218,in_stack_00000210,in_stack_0000020c,
                                   in_stack_00000208,in_stack_00000204,in_stack_00000200,
                                   in_stack_00000230);
          }
          if (((local_3c == STRSCAN_NUM) && ((in_ECX & 1) != 0)) &&
             (in_RDX->u64 != 0x8000000000000000)) {
            dVar4 = in_RDX->n;
            dVar7 = (double)(int)dVar4;
            if ((dVar4 == dVar7) && (!NAN(dVar4) && !NAN(dVar7))) {
              (in_RDX->u32).lo = (int)dVar4;
              return STRSCAN_INT;
            }
          }
          return local_3c;
        }
        if (local_58 != (byte *)0x0) {
          return STRSCAN_ERROR;
        }
        local_58 = local_10;
      }
      else {
        local_94 = local_94 * 10 + (*local_10 & 0xf);
        local_5c = local_5c + 1;
      }
      local_10 = local_10 + 1;
    } while( true );
  }
  if (*local_10 == 0x30) {
    if ((local_10[1] | 0x20) == 0x78) {
      local_44 = 0x10;
      bVar5 = 0x10;
      local_10 = local_10 + 2;
    }
    else {
      if ((local_10[1] | 0x20) == 0x62) {
        local_44 = 2;
        local_10 = local_10 + 2;
      }
      bVar5 = 8;
    }
  }
  do {
    if (*local_10 == 0x30) {
      dig_00 = 1;
    }
    else {
      pbVar2 = local_10;
      if (*local_10 != 0x2e) goto LAB_0012ab75;
      if (local_58 != (byte *)0x0) {
        return STRSCAN_ERROR;
      }
      local_58 = local_10;
    }
    local_10 = local_10 + 1;
  } while( true );
}

Assistant:

StrScanFmt lj_strscan_scan(const uint8_t *p, MSize len, TValue *o,
			   uint32_t opt)
{
  int32_t neg = 0;
  const uint8_t *pe = p + len;

  /* Remove leading space, parse sign and non-numbers. */
  if (LJ_UNLIKELY(!lj_char_isdigit(*p))) {
    while (lj_char_isspace(*p)) p++;
    if (*p == '+' || *p == '-') neg = (*p++ == '-');
    if (LJ_UNLIKELY(*p >= 'A')) {  /* Parse "inf", "infinity" or "nan". */
      TValue tmp;
      setnanV(&tmp);
      if (casecmp(p[0],'i') && casecmp(p[1],'n') && casecmp(p[2],'f')) {
	if (neg) setminfV(&tmp); else setpinfV(&tmp);
	p += 3;
	if (casecmp(p[0],'i') && casecmp(p[1],'n') && casecmp(p[2],'i') &&
	    casecmp(p[3],'t') && casecmp(p[4],'y')) p += 5;
      } else if (casecmp(p[0],'n') && casecmp(p[1],'a') && casecmp(p[2],'n')) {
	p += 3;
      }
      while (lj_char_isspace(*p)) p++;
      if (*p || p < pe) return STRSCAN_ERROR;
      o->u64 = tmp.u64;
      return STRSCAN_NUM;
    }
  }

  /* Parse regular number. */
  {
    StrScanFmt fmt = STRSCAN_INT;
    int cmask = LJ_CHAR_DIGIT;
    int base = (opt & STRSCAN_OPT_C) && *p == '0' ? 0 : 10;
    const uint8_t *sp, *dp = NULL;
    uint32_t dig = 0, hasdig = 0, x = 0;
    int32_t ex = 0;

    /* Determine base and skip leading zeros. */
    if (LJ_UNLIKELY(*p <= '0')) {
      if (*p == '0') {
	if (casecmp(p[1], 'x'))
	  base = 16, cmask = LJ_CHAR_XDIGIT, p += 2;
	else if (casecmp(p[1], 'b'))
	  base = 2, cmask = LJ_CHAR_DIGIT, p += 2;
      }
      for ( ; ; p++) {
	if (*p == '0') {
	  hasdig = 1;
	} else if (*p == '.') {
	  if (dp) return STRSCAN_ERROR;
	  dp = p;
	} else {
	  break;
	}
      }
    }

    /* Preliminary digit and decimal point scan. */
    for (sp = p; ; p++) {
      if (LJ_LIKELY(lj_char_isa(*p, cmask))) {
	x = x * 10 + (*p & 15);  /* For fast path below. */
	dig++;
      } else if (*p == '.') {
	if (dp) return STRSCAN_ERROR;
	dp = p;
      } else {
	break;
      }
    }
    if (!(hasdig | dig)) return STRSCAN_ERROR;

    /* Handle decimal point. */
    if (dp) {
      if (base == 2) return STRSCAN_ERROR;
      fmt = STRSCAN_NUM;
      if (dig) {
	ex = (int32_t)(dp-(p-1)); dp = p-1;
	while (ex < 0 && *dp-- == '0') ex++, dig--;  /* Skip trailing zeros. */
	if (ex <= -STRSCAN_MAXEXP) return STRSCAN_ERROR;
	if (base == 16) ex *= 4;
      }
    }

    /* Parse exponent. */
    if (base >= 10 && casecmp(*p, (uint32_t)(base == 16 ? 'p' : 'e'))) {
      uint32_t xx;
      int negx = 0;
      fmt = STRSCAN_NUM; p++;
      if (*p == '+' || *p == '-') negx = (*p++ == '-');
      if (!lj_char_isdigit(*p)) return STRSCAN_ERROR;
      xx = (*p++ & 15);
      while (lj_char_isdigit(*p)) {
	xx = xx * 10 + (*p & 15);
	if (xx >= STRSCAN_MAXEXP) return STRSCAN_ERROR;
	p++;
      }
      ex += negx ? (int32_t)(~xx+1u) : (int32_t)xx;
    }

    /* Parse suffix. */
    if (*p) {
      /* I (IMAG), U (U32), LL (I64), ULL/LLU (U64), L (long), UL/LU (ulong). */
      /* NYI: f (float). Not needed until cp_number() handles non-integers. */
      if (casecmp(*p, 'i')) {
	if (!(opt & STRSCAN_OPT_IMAG)) return STRSCAN_ERROR;
	p++; fmt = STRSCAN_IMAG;
      } else if (fmt == STRSCAN_INT) {
	if (casecmp(*p, 'u')) p++, fmt = STRSCAN_U32;
	if (casecmp(*p, 'l')) {
	  p++;
	  if (casecmp(*p, 'l')) p++, fmt += STRSCAN_I64 - STRSCAN_INT;
	  else if (!(opt & STRSCAN_OPT_C)) return STRSCAN_ERROR;
	  else if (sizeof(long) == 8) fmt += STRSCAN_I64 - STRSCAN_INT;
	}
	if (casecmp(*p, 'u') && (fmt == STRSCAN_INT || fmt == STRSCAN_I64))
	  p++, fmt += STRSCAN_U32 - STRSCAN_INT;
	if ((fmt == STRSCAN_U32 && !(opt & STRSCAN_OPT_C)) ||
	    (fmt >= STRSCAN_I64 && !(opt & STRSCAN_OPT_LL)))
	  return STRSCAN_ERROR;
      }
      while (lj_char_isspace(*p)) p++;
      if (*p) return STRSCAN_ERROR;
    }
    if (p < pe) return STRSCAN_ERROR;

    /* Fast path for decimal 32 bit integers. */
    if (fmt == STRSCAN_INT && base == 10 &&
	(dig < 10 || (dig == 10 && *sp <= '2' && x < 0x80000000u+neg))) {
      if ((opt & STRSCAN_OPT_TONUM)) {
	o->n = neg ? -(double)x : (double)x;
	return STRSCAN_NUM;
      } else if (x == 0 && neg) {
	o->n = -0.0;
	return STRSCAN_NUM;
      } else {
	o->i = neg ? (int32_t)(~x+1u) : (int32_t)x;
	return STRSCAN_INT;
      }
    }

    /* Dispatch to base-specific parser. */
    if (base == 0 && !(fmt == STRSCAN_NUM || fmt == STRSCAN_IMAG))
      return strscan_oct(sp, o, fmt, neg, dig);
    if (base == 16)
      fmt = strscan_hex(sp, o, fmt, opt, ex, neg, dig);
    else if (base == 2)
      fmt = strscan_bin(sp, o, fmt, opt, ex, neg, dig);
    else
      fmt = strscan_dec(sp, o, fmt, opt, ex, neg, dig);

    /* Try to convert number to integer, if requested. */
    if (fmt == STRSCAN_NUM && (opt & STRSCAN_OPT_TOINT) && !tvismzero(o)) {
      double n = o->n;
      int32_t i = lj_num2int(n);
      if (n == (lua_Number)i) { o->i = i; return STRSCAN_INT; }
    }
    return fmt;
  }
}